

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create_table.cpp
# Opt level: O3

void duckdb::CreateColumnDependencyManager(BoundCreateTableInfo *info)

{
  pointer pCVar1;
  bool bVar2;
  pointer pCVar3;
  ColumnList *pCVar4;
  ColumnDefinition *this;
  idx_t iVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  ColumnListIterator CVar6;
  ColumnLogicalIteratorInternal local_50;
  
  pCVar3 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (&info->base);
  this_00 = &pCVar3[1].catalog.field_2;
  CVar6 = ColumnList::Logical((ColumnList *)this_00);
  pCVar4 = CVar6.list;
  local_50.physical = CVar6.physical;
  if (((undefined1  [16])CVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pCVar1 = (pCVar4->columns).
             super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
             super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_50.end = ((long)pCVar1 -
                    (long)(pCVar4->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    iVar5 = ((long)pCVar1 -
             (long)(pCVar4->columns).
                   super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   .
                   super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
  }
  else {
    iVar5 = (long)(pCVar4->physical_columns).
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pCVar4->physical_columns).
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    local_50.end = iVar5;
  }
  local_50.pos = 0;
  local_50.list = pCVar4;
  while (((local_50.pos != iVar5 || (local_50.end != iVar5)) || (local_50.list != pCVar4))) {
    this = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*(&local_50);
    bVar2 = ColumnDefinition::Generated(this);
    if (bVar2) {
      ColumnDependencyManager::AddGeneratedColumn
                (&info->column_dependency_manager,this,(ColumnList *)this_00);
    }
    local_50.pos = local_50.pos + 1;
  }
  return;
}

Assistant:

static void CreateColumnDependencyManager(BoundCreateTableInfo &info) {
	auto &base = info.base->Cast<CreateTableInfo>();
	for (auto &col : base.columns.Logical()) {
		if (!col.Generated()) {
			continue;
		}
		info.column_dependency_manager.AddGeneratedColumn(col, base.columns);
	}
}